

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall
Refal2::CInternalProgramBuilder::linkFunction
          (CInternalProgramBuilder *this,CPreparatoryFunction *function,
          TRuntimeModuleId runtimeModuleId)

{
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  TPreparatoryFunctionType TVar1;
  element_type *peVar2;
  CRuntimeModule *pCVar3;
  CKeyDataPair *pCVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  CPreparatoryFunction *pCVar8;
  uint uVar9;
  _Rb_tree_color _Var10;
  string *__k;
  const_iterator cVar11;
  COrdinaryFunction *__p;
  TOperationAddress pCVar12;
  CRuntimeFunction *__tmp;
  char *__function;
  shared_ptr<Refal2::CRuntimeFunction> *this_01;
  CPreparatoryFunction *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  if ((runtimeModuleId < 0) ||
     (peVar2 = (this->program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar2->modulesSize <= runtimeModuleId)) {
    __assert_fail("moduleId >= 0 && moduleId < modulesSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x18,"CRuntimeModule &Refal2::CProgram::Module(TRuntimeModuleId)");
  }
  pCVar3 = peVar2->modules;
  this_00 = &pCVar3[(uint)runtimeModuleId].Functions;
  uVar9 = CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::AddKey(this_00,&function->name);
  if (((int)uVar9 < 0) || (pCVar3[(uint)runtimeModuleId].Functions.size <= (int)uVar9)) {
    __function = 
    "Data &Refal2::CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>>::GetData(int) const [Data = std::shared_ptr<Refal2::CRuntimeFunction>, Key = std::basic_string<char>]"
    ;
LAB_0012957c:
    __assert_fail("index >= 0 && index < size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Dictionary.h"
                  ,0x8e,__function);
  }
  pCVar4 = this_00->keyDataPairs;
  if (pCVar4[uVar9].data.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    __assert_fail("!static_cast<bool>( runtimeFunction )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x14d,
                  "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                 );
  }
  this_01 = &pCVar4[uVar9].data;
  TVar1 = function->type;
  if (TVar1 == PFT_Compiled) {
    __p = (COrdinaryFunction *)operator_new(0x18);
    pCVar12 = CPreparatoryFunction::FirstOperation(function);
    (__p->super_CRuntimeFunction).type = RFT_Ordinary;
    __p->firstOperation = pCVar12;
    __p->runtimeModuleId = runtimeModuleId;
    if (pCVar12 != (TOperationAddress)0x0) {
      std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
      reset<Refal2::COrdinaryFunction>
                (&this_01->super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>,
                 __p);
      return;
    }
    __assert_fail("firstOperation != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Function.h"
                  ,0x4b,
                  "Refal2::COrdinaryFunction::COrdinaryFunction(const TOperationAddress, TRuntimeModuleId)"
                 );
  }
  if (TVar1 == PFT_External) {
    __k = CPreparatoryFunction::ExternalName_abi_cxx11_(function);
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&(this->globals).keyToIndex._M_t,__k);
    if ((_Rb_tree_header *)cVar11._M_node ==
        &(this->globals).keyToIndex._M_t._M_impl.super__Rb_tree_header) {
      _Var10 = ~_S_red;
    }
    else {
      _Var10 = cVar11._M_node[2]._M_color;
    }
    if (_Var10 == ~_S_red) {
      __assert_fail("globalIndex != InvalidDictionaryIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                    ,0x15a,
                    "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                   );
    }
    if (((int)_Var10 < 0) || ((this->globals).size <= (int)_Var10)) {
      __function = 
      "Data &Refal2::CDictionary<Refal2::CGlobalFunctionData>::GetData(int) const [Data = Refal2::CGlobalFunctionData, Key = std::basic_string<char>]"
      ;
      goto LAB_0012957c;
    }
    CGlobalFunctionData::RuntimeFunction
              ((CGlobalFunctionData *)&local_48,
               (CProgramPtr *)&(this->globals).keyDataPairs[_Var10].data);
    p_Var7 = p_Stack_40;
    pCVar8 = local_48;
    local_48 = (CPreparatoryFunction *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var6 = pCVar4[uVar9].data.
             super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this_01->super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)pCVar8;
    pCVar4[uVar9].data.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  else {
    if (TVar1 != PFT_Empty) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                    ,0x160,
                    "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                   );
    }
    peVar2 = (this->program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    peVar5 = (peVar2->emptyFunction).
             super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var6 = (peVar2->emptyFunction).
             super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    (this_01->super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar5;
    p_Var7 = pCVar4[uVar9].data.
             super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    pCVar4[uVar9].data.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      return;
    }
  }
  return;
}

Assistant:

CRuntimeModule& CProgram::Module( TRuntimeModuleId moduleId )
{
	assert( moduleId >= 0 && moduleId < modulesSize );
	return modules[moduleId];
}